

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  ImRect *pIVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  ImGuiWindow *pIVar4;
  ImGuiWindow *pIVar5;
  ImGuiPtrOrIndex *pIVar6;
  float *__src;
  float fVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  ImU32 IVar10;
  ImGuiTableColumn *p;
  ImGuiTable *p_00;
  ImGuiPtrOrIndex *__dest;
  float *__dest_00;
  long lVar11;
  ImGuiTableColumn *pIVar12;
  char *__dest_01;
  int iVar13;
  int iVar14;
  uint uVar15;
  ImRect *pIVar16;
  ulong uVar17;
  ImGuiContext *g;
  size_t size;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ImGuiTableColumn *pIVar21;
  char *pcVar22;
  int iVar23;
  uint uVar24;
  float fVar25;
  undefined4 in_XMM0_Db;
  ImVec2 IVar26;
  ImVec2 IVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  ImRect outer_rect;
  ImRect local_98;
  undefined8 local_88;
  ulong local_70;
  ImPool<ImGuiTable> *local_68;
  char *local_60;
  ImVec2 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined7 uStack_40;
  undefined4 uStack_39;
  undefined4 uStack_35;
  
  pIVar8 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->WriteAccessed = true;
  if (pIVar4->SkipItems == false) {
    uVar17 = (ulong)(uint)columns_count;
    if (0x3f < columns_count - 1U) {
      __assert_fail("columns_count > 0 && columns_count <= 64 && \"Only 1..64 columns allowed!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_tables.cpp"
                    ,0xf6,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
    local_60 = name;
    if ((((uint)flags >> 0x18 & 1) != 0) && (inner_width < 0.0)) {
      __assert_fail("inner_width >= 0.0f",
                    "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_tables.cpp"
                    ,0xf8,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
    local_88 = (ImGuiPtrOrIndex *)CONCAT44(in_XMM0_Db,inner_width);
    IVar26 = GetContentRegionAvail();
    fVar28 = IVar26.x;
    fVar30 = IVar26.y;
    if (fVar28 <= 1.0) {
      fVar28 = 1.0;
    }
    if ((flags & 0x3000000U) == 0) {
      IVar26 = CalcItemSize(*outer_size,fVar28,0.0);
      local_98.Min = (pIVar4->DC).CursorPos;
      local_98.Max.y = IVar26.y + (pIVar4->DC).CursorPos.y;
      local_98.Max.x = (pIVar4->DC).CursorPos.x + IVar26.x;
    }
    else {
      if (fVar30 <= 1.0) {
        fVar30 = 1.0;
      }
      IVar26 = CalcItemSize(*outer_size,fVar28,fVar30);
      local_98.Min = (pIVar4->DC).CursorPos;
      local_98.Max.y = IVar26.y + (pIVar4->DC).CursorPos.y;
      local_98.Max.x = (pIVar4->DC).CursorPos.x + IVar26.x;
      bVar9 = IsClippedEx(&local_98,0,false);
      if (bVar9) {
        ItemSize(&local_98,-1.0);
        goto LAB_001aee9a;
      }
    }
    local_68 = &pIVar8->Tables;
    p_00 = ImPool<ImGuiTable>::GetOrAddByKey(local_68,id);
    iVar23 = pIVar8->FrameCount;
    iVar13 = 0;
    if (p_00->LastFrameActive == iVar23) {
      iVar13 = p_00->InstanceCurrent + 1;
    }
    uVar15 = p_00->Flags;
    if ((0 < iVar13) && (p_00->ColumnsCount != columns_count)) {
      __assert_fail("table->ColumnsCount == columns_count && \"BeginTable(): Cannot change columns count mid-frame while preserving same ID\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_tables.cpp"
                    ,0x10b,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
    uVar18 = 0;
    if ((flags & 0x6000U) == 0) {
      uVar18 = ((flags & 0x1000000U) >> 0xb) + 0x2000;
    }
    uVar24 = uVar18 | flags & 0xfffbfffeU | 0x40000;
    if (-1 < (short)flags) {
      uVar24 = uVar18 | flags;
    }
    uVar18 = (uVar24 & 1) << 9;
    uVar19 = uVar18 | uVar24;
    uVar18 = uVar18 | uVar24 & 0xfffdffff;
    if ((uVar24 & 0x3000000) == 0) {
      uVar18 = uVar19;
    }
    if ((uVar24 >> 0x11 & 1) == 0) {
      uVar18 = uVar19;
    }
    uVar24 = uVar18 & 0xfffff7ff;
    if ((uVar18 >> 0xc & 1) == 0) {
      uVar24 = uVar18;
    }
    uVar18 = uVar24;
    if ((uVar24 & 0xf) == 0) {
      uVar18 = uVar24 | 0x10;
    }
    if (((uint)pIVar4->RootWindow->Flags >> 8 & 1) != 0) {
      uVar18 = uVar24 | 0x10;
    }
    pIVar1 = &p_00->WorkRect;
    p_00->ID = id;
    p_00->Flags = uVar18;
    p_00->InstanceCurrent = (ImS16)iVar13;
    p_00->LastFrameActive = iVar23;
    p_00->InnerWindow = pIVar4;
    p_00->OuterWindow = pIVar4;
    p_00->ColumnsCount = columns_count;
    p_00->IsLayoutLocked = false;
    p_00->InnerWidth = (float)local_88;
    (p_00->OuterRect).Min = local_98.Min;
    (p_00->OuterRect).Max = local_98.Max;
    (p_00->WorkRect).Min = local_98.Min;
    (p_00->WorkRect).Max = local_98.Max;
    local_70 = uVar17;
    if ((flags & 0x3000000U) != 0) {
      fVar28 = (float)local_88;
      if ((uVar18 & 0x1000000) == 0) {
        fVar28 = 3.4028235e+38;
      }
      fVar28 = (float)(~-(uint)(0.0 < (float)local_88) & 0x7f7fffff |
                      (uint)fVar28 & -(uint)(0.0 < (float)local_88));
      if (fVar28 != 3.4028235e+38 || (uVar18 & 0x3000000) == 0x1000000) {
        if ((uVar18 & 0x3000000) == 0x1000000) {
          local_58.y = 1.1754944e-38;
        }
        else {
          local_58.y = 0.0;
        }
        local_58.x = (float)(-(uint)(fVar28 != 3.4028235e+38) & (uint)fVar28);
        SetNextWindowContentSize(&local_58);
      }
      local_58.x = (p_00->OuterRect).Max.x - (p_00->OuterRect).Min.x;
      local_58.y = (p_00->OuterRect).Max.y - (p_00->OuterRect).Min.y;
      BeginChildEx(local_60,iVar13 + id,&local_58,false,(uVar18 & 0x1000000) >> 0xd);
      pIVar5 = pIVar8->CurrentWindow;
      p_00->InnerWindow = pIVar5;
      IVar26 = (pIVar5->WorkRect).Max;
      pIVar1->Min = (pIVar5->WorkRect).Min;
      (p_00->WorkRect).Max = IVar26;
      fVar28 = (pIVar5->Pos).x;
      fVar30 = (pIVar5->Pos).y;
      fVar25 = (pIVar5->Size).x;
      fVar29 = (pIVar5->Size).y;
      fVar7 = (pIVar5->Pos).y;
      (p_00->OuterRect).Min.x = (pIVar5->Pos).x;
      (p_00->OuterRect).Min.y = fVar7;
      (p_00->OuterRect).Max.x = fVar28 + fVar25;
      (p_00->OuterRect).Max.y = fVar30 + fVar29;
      if (((((pIVar5->WindowPadding).x != 0.0) ||
           (fVar28 = (pIVar5->WindowPadding).y, fVar28 != 0.0)) || (NAN(fVar28))) ||
         ((pIVar5->WindowBorderSize != 0.0 || (NAN(pIVar5->WindowBorderSize))))) {
        __assert_fail("table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_tables.cpp"
                      ,0x135,
                      "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                     );
      }
    }
    PushOverrideID(iVar13 + id);
    pIVar5 = p_00->InnerWindow;
    p_00->HostIndentX = (pIVar5->DC).Indent.x;
    IVar26 = (pIVar5->ClipRect).Max;
    (p_00->HostClipRect).Min = (pIVar5->ClipRect).Min;
    (p_00->HostClipRect).Max = IVar26;
    p_00->HostSkipItems = pIVar5->SkipItems;
    IVar26 = (pIVar5->WorkRect).Max;
    (p_00->HostBackupWorkRect).Min = (pIVar5->WorkRect).Min;
    (p_00->HostBackupWorkRect).Max = IVar26;
    IVar26 = (pIVar5->ParentWorkRect).Max;
    (p_00->HostBackupParentWorkRect).Min = (pIVar5->ParentWorkRect).Min;
    (p_00->HostBackupParentWorkRect).Max = IVar26;
    (p_00->HostBackupColumnsOffset).x = (pIVar4->DC).ColumnsOffset.x;
    p_00->HostBackupPrevLineSize = (pIVar5->DC).PrevLineSize;
    p_00->HostBackupCurrLineSize = (pIVar5->DC).CurrLineSize;
    p_00->HostBackupCursorMaxPos = (pIVar5->DC).CursorMaxPos;
    p_00->HostBackupItemWidth = (pIVar4->DC).ItemWidth;
    p_00->HostBackupItemWidthStackSize = (pIVar4->DC).ItemWidthStack.Size;
    IVar26 = (p_00->WorkRect).Max;
    (pIVar5->ParentWorkRect).Min = pIVar1->Min;
    (pIVar5->ParentWorkRect).Max = IVar26;
    fVar28 = 0.0;
    fVar30 = 0.0;
    if ((uVar18 >> 9 & 1) != 0) {
      fVar30 = 1.0;
    }
    (pIVar5->DC).CurrLineSize.x = 0.0;
    (pIVar5->DC).CurrLineSize.y = 0.0;
    (pIVar5->DC).PrevLineSize.x = 0.0;
    (pIVar5->DC).PrevLineSize.y = 0.0;
    if ((uVar18 & 0x800200) == 0) {
      fVar28 = (pIVar8->Style).CellPadding.x;
    }
    fVar29 = 0.0;
    fVar25 = 0.0;
    if ((uVar18 & 0x800200) == 0x200) {
      fVar25 = (pIVar8->Style).CellPadding.x;
    }
    p_00->CellSpacingX1 = fVar30 + fVar28;
    p_00->CellSpacingX2 = fVar28;
    p_00->CellPaddingX = fVar25;
    p_00->CellPaddingY = (pIVar8->Style).CellPadding.y;
    fVar28 = 0.0;
    if ((uVar18 >> 10 & 1) != 0) {
      fVar28 = 1.0;
    }
    if ((uVar18 >> 0x16 & 1) == 0 && (uVar18 & 0x200400) != 0) {
      fVar29 = (pIVar8->Style).CellPadding.x;
    }
    p_00->OuterPaddingX = (fVar28 + fVar29) - fVar25;
    p_00->CurrentRow = -1;
    p_00->CurrentColumn = -1;
    p_00->RowBgColorCounter = 0;
    *(uint *)&p_00->field_0x90 = (uint)*(ushort *)&p_00->field_0x90;
    pIVar16 = &pIVar5->ClipRect;
    if (pIVar5 == pIVar4) {
      pIVar16 = pIVar1;
    }
    IVar26 = pIVar16->Max;
    (p_00->InnerClipRect).Min = pIVar16->Min;
    (p_00->InnerClipRect).Max = IVar26;
    fVar28 = (p_00->InnerClipRect).Min.x;
    fVar30 = (p_00->InnerClipRect).Min.y;
    fVar25 = (p_00->WorkRect).Min.x;
    fVar29 = (p_00->WorkRect).Min.y;
    uVar24 = -(uint)(fVar25 <= fVar28);
    IVar26.x = (float)(~uVar24 & (uint)fVar25 | (uint)fVar28 & uVar24);
    uVar24 = -(uint)(fVar29 <= fVar30);
    IVar26.y = (float)(~uVar24 & (uint)fVar29 | (uint)fVar30 & uVar24);
    (p_00->InnerClipRect).Min = IVar26;
    fVar30 = (p_00->InnerClipRect).Max.x;
    fVar28 = (p_00->WorkRect).Max.x;
    if (fVar28 <= fVar30) {
      fVar30 = fVar28;
    }
    fVar28 = (p_00->InnerClipRect).Max.y;
    fVar25 = (p_00->WorkRect).Max.y;
    if (fVar25 <= fVar28) {
      fVar28 = fVar25;
    }
    IVar27.y = fVar28;
    IVar27.x = fVar30;
    (p_00->InnerClipRect).Max = IVar27;
    ImRect::ClipWithFull(&p_00->InnerClipRect,&p_00->HostClipRect);
    if ((uVar18 >> 0x11 & 1) == 0) {
      fVar28 = (pIVar5->ClipRect).Max.y;
    }
    else {
      fVar28 = (p_00->InnerClipRect).Max.y;
      fVar30 = (pIVar5->WorkRect).Max.y;
      if (fVar30 <= fVar28) {
        fVar28 = fVar30;
      }
    }
    (p_00->InnerClipRect).Max.y = fVar28;
    IVar26 = (p_00->InnerClipRect).Max;
    (p_00->BgClipRect).Min = (p_00->InnerClipRect).Min;
    (p_00->BgClipRect).Max = IVar26;
    IVar26 = (p_00->HostClipRect).Max;
    (p_00->BgClipRectForDrawCmd).Min = (p_00->HostClipRect).Min;
    (p_00->BgClipRectForDrawCmd).Max = IVar26;
    if ((p_00->BgClipRect).Max.y < (p_00->BgClipRect).Min.y) {
      __assert_fail("table->BgClipRect.Min.y <= table->BgClipRect.Max.y",
                    "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_tables.cpp"
                    ,0x16c,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
    fVar28 = (p_00->WorkRect).Min.y;
    p_00->RowPosY2 = fVar28;
    p_00->RowPosY1 = fVar28;
    p_00->RowTextBaseline = 0.0;
    p_00->FreezeRowsRequest = '\0';
    p_00->FreezeRowsCount = '\0';
    p_00->FreezeColumnsRequest = '\0';
    p_00->FreezeColumnsCount = '\0';
    p_00->IsUnfrozen = true;
    p_00->DeclColumnsCount = '\0';
    p_00->RightMostEnabledColumn = -1;
    IVar10 = GetColorU32(0x2b,1.0);
    p_00->BorderColorStrong = IVar10;
    IVar10 = GetColorU32(0x2c,1.0);
    p_00->BorderColorLight = IVar10;
    fVar28 = (p_00->InnerClipRect).Max.x;
    p_00->BorderX1 = (p_00->InnerClipRect).Min.x;
    p_00->BorderX2 = fVar28;
    uVar24 = ImPool<ImGuiTable>::GetIndex(local_68,p_00);
    iVar23 = (pIVar8->CurrentTableStack).Size;
    iVar13 = (pIVar8->CurrentTableStack).Capacity;
    if (iVar23 == iVar13) {
      iVar23 = iVar23 + 1;
      if (iVar13 == 0) {
        iVar14 = 8;
      }
      else {
        iVar14 = iVar13 / 2 + iVar13;
      }
      if (iVar23 < iVar14) {
        iVar23 = iVar14;
      }
      if (iVar13 < iVar23) {
        __dest = (ImGuiPtrOrIndex *)MemAlloc((long)iVar23 << 4);
        pIVar6 = (pIVar8->CurrentTableStack).Data;
        if (pIVar6 != (ImGuiPtrOrIndex *)0x0) {
          local_88 = __dest;
          memcpy(__dest,pIVar6,(long)(pIVar8->CurrentTableStack).Size << 4);
          MemFree((pIVar8->CurrentTableStack).Data);
          __dest = local_88;
        }
        (pIVar8->CurrentTableStack).Data = __dest;
        (pIVar8->CurrentTableStack).Capacity = iVar23;
      }
    }
    pIVar6 = (pIVar8->CurrentTableStack).Data;
    iVar23 = (pIVar8->CurrentTableStack).Size;
    pIVar6[iVar23].Ptr = (void *)0x0;
    pIVar6[iVar23].Index = uVar24;
    (pIVar8->CurrentTableStack).Size = (pIVar8->CurrentTableStack).Size + 1;
    pIVar8->CurrentTable = p_00;
    (pIVar4->DC).CurrentTableIdx = uVar24;
    if (pIVar5 != pIVar4) {
      (pIVar5->DC).CurrentTableIdx = uVar24;
    }
    if (((uVar15 & 2) != 0) && ((uVar18 & 2) == 0)) {
      p_00->IsResetDisplayOrderRequest = true;
    }
    if ((pIVar8->TablesLastTimeActive).Size <= (int)uVar24) {
      iVar23 = uVar24 + 1;
      iVar13 = (pIVar8->TablesLastTimeActive).Capacity;
      if (iVar13 <= (int)uVar24) {
        if (iVar13 == 0) {
          iVar14 = 8;
        }
        else {
          iVar14 = iVar13 / 2 + iVar13;
        }
        if (iVar14 <= iVar23) {
          iVar14 = iVar23;
        }
        if (iVar13 < iVar14) {
          __dest_00 = (float *)MemAlloc((long)iVar14 << 2);
          __src = (pIVar8->TablesLastTimeActive).Data;
          if (__src != (float *)0x0) {
            memcpy(__dest_00,__src,(long)(pIVar8->TablesLastTimeActive).Size << 2);
            MemFree((pIVar8->TablesLastTimeActive).Data);
          }
          (pIVar8->TablesLastTimeActive).Data = __dest_00;
          (pIVar8->TablesLastTimeActive).Capacity = iVar14;
        }
      }
      iVar13 = (pIVar8->TablesLastTimeActive).Size;
      lVar11 = (long)iVar13;
      if (iVar13 <= (int)uVar24) {
        do {
          (pIVar8->TablesLastTimeActive).Data[lVar11] = -1.0;
          lVar11 = lVar11 + 1;
        } while (iVar23 != lVar11);
      }
      (pIVar8->TablesLastTimeActive).Size = iVar23;
    }
    uVar17 = local_70;
    if (((int)uVar24 < 0) || ((pIVar8->TablesLastTimeActive).Size <= (int)uVar24)) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui.h"
                    ,0x644,"T &ImVector<float>::operator[](int) [T = float]");
    }
    (pIVar8->TablesLastTimeActive).Data[uVar24] = (float)pIVar8->Time;
    p_00->MemoryCompacted = false;
    iVar23 = (int)((ulong)((long)(p_00->Columns).DataEnd - (long)(p_00->Columns).Data) >> 3) *
             -0x3b13b13b;
    iVar13 = (int)local_70;
    if (iVar23 != iVar13 && iVar23 != 0) {
      MemFree(p_00->RawData);
      p_00->RawData = (void *)0x0;
    }
    if (p_00->RawData == (void *)0x0) {
      TableBeginInitMemory(p_00,iVar13);
      p_00->IsSettingsRequestLoad = true;
      p_00->IsInitializing = true;
    }
    if (p_00->IsResetAllRequest == true) {
      p_00->IsInitializing = true;
      p_00->IsResetAllRequest = false;
      p_00->IsSettingsRequestLoad = false;
      p_00->IsSettingsDirty = true;
      p_00->SettingsLoadedFlags = 0;
    }
    if (p_00->IsInitializing == true) {
      p_00->SettingsOffset = -1;
      p_00->IsSortSpecsDirty = true;
      p_00->InstanceInteracted = -1;
      p_00->ContextPopupColumn = -1;
      p_00->ReorderColumn = -1;
      p_00->HoveredColumnBody = -1;
      p_00->HoveredColumnBorder = -1;
      p_00->AutoFitSingleStretchColumn = -1;
      p_00->ResizedColumn = -1;
      p_00->LastResizedColumn = -1;
      if (0 < iVar13) {
        lVar11 = 0x60;
        uVar20 = 0;
        do {
          pIVar12 = (p_00->Columns).Data;
          pIVar21 = (ImGuiTableColumn *)((long)pIVar12 + lVar11 + -0x60);
          if ((p_00->Columns).DataEnd <= pIVar21) goto LAB_001af941;
          uVar3 = *(undefined4 *)((long)pIVar12 + lVar11 + -0x38);
          local_48 = 0;
          uStack_40 = 0;
          local_58.x = 0.0;
          local_58.y = 0.0;
          uStack_50 = 0;
          uStack_39 = 0xffffff00;
          uStack_35 = 0xffffffff;
          *(undefined4 *)((long)pIVar12 + lVar11 + -0x40) = 0;
          *(undefined8 *)((long)pIVar12 + lVar11 + -0x50) = 0;
          *(undefined8 *)((long)pIVar12 + lVar11 + -0x48) = 0;
          (pIVar21->ClipRect).Min.x = 0.0;
          (pIVar21->ClipRect).Min.y = 0.0;
          *(undefined8 *)((long)pIVar12 + lVar11 + -0x58) = 0;
          *(undefined8 *)((long)pIVar12 + lVar11 + -0x3c) = 0xbf800000;
          *(undefined4 *)((long)pIVar12 + lVar11 + -0x34) = 0xbf800000;
          puVar2 = (undefined8 *)((long)pIVar12 + lVar11 + -0x30);
          *puVar2 = 0;
          puVar2[1] = 0;
          puVar2 = (undefined8 *)((long)pIVar12 + lVar11 + -0x20);
          *puVar2 = 0;
          puVar2[1] = 0;
          *(undefined8 *)((long)pIVar12 + lVar11 + -0x11) = 0xffffffffffffff00;
          *(undefined2 *)((long)pIVar12 + lVar11 + -9) = 0xffff;
          *(undefined1 *)((long)pIVar12 + lVar11 + -7) = 0xff;
          *(undefined8 *)((long)pIVar12 + lVar11 + -6) = 0;
          *(undefined4 *)((long)&(pIVar12->ClipRect).Min.x + lVar11 + 2) = 0;
          *(undefined4 *)((long)pIVar12 + lVar11 + -0x38) = uVar3;
          *(undefined1 *)((long)&(pIVar12->ClipRect).Min.x + lVar11) = 1;
          pcVar22 = (p_00->DisplayOrderToIndex).Data + uVar20;
          if ((p_00->DisplayOrderToIndex).DataEnd <= pcVar22) {
            pcVar22 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
            goto LAB_001af96d;
          }
          *pcVar22 = (char)uVar20;
          *(char *)((long)pIVar12 + lVar11 + -0xe) = (char)uVar20;
          *(undefined2 *)((long)pIVar12 + lVar11 + -6) = 0x101;
          uVar20 = uVar20 + 1;
          lVar11 = lVar11 + 0x68;
        } while ((uVar17 & 0xffffffff) != uVar20);
      }
    }
    if (p_00->IsSettingsRequestLoad == true) {
      TableLoadSettings(p_00);
    }
    fVar28 = pIVar8->FontSize;
    fVar30 = p_00->RefScale;
    if ((fVar30 != 0.0) || (NAN(fVar30))) {
      if (((fVar30 != fVar28) || (NAN(fVar30) || NAN(fVar28))) && (0 < iVar13)) {
        pIVar12 = (p_00->Columns).Data;
        uVar17 = uVar17 & 0xffffffff;
        do {
          if ((p_00->Columns).DataEnd <= pIVar12) {
LAB_001af941:
            pcVar22 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_001af96d:
            __assert_fail("p >= Data && p < DataEnd",
                          "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_internal.h"
                          ,0x20b,pcVar22);
          }
          pIVar12->WidthRequest = pIVar12->WidthRequest * (fVar28 / fVar30);
          pIVar12 = pIVar12 + 1;
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
      }
    }
    p_00->RefScale = fVar28;
    pIVar5->SkipItems = true;
    if (0 < (p_00->ColumnsNames).Buf.Size) {
      iVar23 = (p_00->ColumnsNames).Buf.Capacity;
      if (iVar23 < 0) {
        uVar15 = iVar23 / 2 + iVar23;
        size = 0;
        if (0 < (int)uVar15) {
          size = (size_t)uVar15;
        }
        __dest_01 = (char *)MemAlloc(size);
        pcVar22 = (p_00->ColumnsNames).Buf.Data;
        if (pcVar22 != (char *)0x0) {
          memcpy(__dest_01,pcVar22,(long)(p_00->ColumnsNames).Buf.Size);
          MemFree((p_00->ColumnsNames).Buf.Data);
        }
        (p_00->ColumnsNames).Buf.Data = __dest_01;
        (p_00->ColumnsNames).Buf.Capacity = (int)size;
      }
      (p_00->ColumnsNames).Buf.Size = 0;
    }
    TableBeginApplyRequests(p_00);
    bVar9 = true;
  }
  else {
LAB_001aee9a:
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0, false))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Fix flags
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    table->OuterRect = outer_rect;
    table->WorkRect = outer_rect;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, table->OuterRect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    table->HostBackupWorkRect = inner_window->WorkRect;
    table->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    table->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    table->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    table->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    table->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    table->HostBackupItemWidth = outer_window->DC.ItemWidth;
    table->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->ParentWorkRect = table->WorkRect;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    // Initial draw cmd starts with a BgClipRect that matches the one of its host, to facilitate merge draw commands by default.
    // This is because all our cell highlight are manually clipped with BgClipRect
    // Larger at first, if/after unfreezing will become same as tight
    table->BgClipRect = table->InnerClipRect;
    table->BgClipRectForDrawCmd = table->HostClipRect;
    IM_ASSERT(table->BgClipRect.Min.y <= table->BgClipRect.Max.y);

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozen = true;
    table->DeclColumnsCount = 0;
    table->RightMostEnabledColumn = -1;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);
    table->BorderX1 = table->InnerClipRect.Min.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : -1.0f);
    table->BorderX2 = table->InnerClipRect.Max.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : +1.0f);

    // Make table current
    const int table_idx = g.Tables.GetIndex(table);
    g.CurrentTableStack.push_back(ImGuiPtrOrIndex(table_idx));
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    const int stored_size = table->Columns.size();
    if (stored_size != 0 && stored_size != columns_count)
    {
        IM_FREE(table->RawData);
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleStretchColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            float width_auto = column->WidthAuto;
            *column = ImGuiTableColumn();
            column->WidthAuto = width_auto;
            column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
            column->IsEnabled = column->IsEnabledNextFrame = true;
        }
    }

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}